

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_chains<VkSubpassDependency2>
          (Impl *this,VkSubpassDependency2 *ts,uint32_t count,ScratchAllocator *alloc,
          DynamicStateInfo *dynamic_state_info,VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  bool bVar1;
  uint local_40;
  uint32_t i;
  VkGraphicsPipelineLibraryFlagsEXT state_flags_local;
  DynamicStateInfo *dynamic_state_info_local;
  ScratchAllocator *alloc_local;
  uint32_t count_local;
  VkSubpassDependency2 *ts_local;
  Impl *this_local;
  
  local_40 = 0;
  while( true ) {
    if (count <= local_40) {
      return true;
    }
    bVar1 = copy_pnext_chain(this,ts[local_40].pNext,alloc,&ts[local_40].pNext,dynamic_state_info,
                             state_flags);
    if (!bVar1) break;
    local_40 = local_40 + 1;
  }
  return false;
}

Assistant:

bool StateRecorder::Impl::copy_pnext_chains(const T *ts, uint32_t count, ScratchAllocator &alloc,
                                            const DynamicStateInfo *dynamic_state_info,
                                            VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	for (uint32_t i = 0; i < count; i++)
		if (!copy_pnext_chain(ts[i].pNext, alloc, &const_cast<T&>(ts[i]).pNext, dynamic_state_info, state_flags))
			return false;
	return true;
}